

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicWait(BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef expected
                  ,BinaryenExpressionRef timeout,BinaryenType expectedType,char *memoryName)

{
  AtomicWait *pAVar1;
  Builder local_48;
  IString local_40;
  
  local_48.wasm = module;
  local_40.str = (string_view)getMemoryName(module,memoryName);
  pAVar1 = wasm::Builder::makeAtomicWait
                     (&local_48,ptr,expected,timeout,(Type)expectedType,(Address)0x0,
                      (Name)local_40.str);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicWait(BinaryenModuleRef module,
                                         BinaryenExpressionRef ptr,
                                         BinaryenExpressionRef expected,
                                         BinaryenExpressionRef timeout,
                                         BinaryenType expectedType,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicWait((Expression*)ptr,
                      (Expression*)expected,
                      (Expression*)timeout,
                      Type(expectedType),
                      0,
                      getMemoryName(module, memoryName)));
}